

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliffs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ostream *poVar5;
  char *pcVar6;
  bool local_219;
  bool cliff_right;
  bool cliff_front_right;
  bool cliff_front_left;
  bool cliff_left;
  Create local_1e8 [8];
  Create robot;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  int baud;
  allocator local_59;
  string local_58 [8];
  string port;
  RobotModel model;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"/dev/ttyUSB0",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_70 = 0x1c200;
  local_219 = false;
  if (1 < argc) {
    pcVar6 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar6,&local_91);
    local_219 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"create1");
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if (local_219 == false) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Running driver for Create 2");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_70 = 0xe100;
    poVar5 = std::operator<<((ostream *)&std::cout,"Running driver for Create 1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  create::Create::Create(local_1e8,1);
  bVar1 = create::Create::connect((string *)local_1e8,(int *)local_58);
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    create::Create::~Create(local_1e8);
    std::__cxx11::string::~string(local_58);
    return 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  create::Create::setMode((CreateMode *)local_1e8);
  do {
    bVar1 = create::Create::isCliffLeft();
    bVar2 = create::Create::isCliffFrontLeft();
    bVar3 = create::Create::isCliffFrontRight();
    bVar4 = create::Create::isCliffRight();
    poVar5 = std::operator<<((ostream *)&std::cout,"\rCliffs (left to right): [ ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar1 & 1));
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar2 & 1));
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar3 & 1));
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(bool)(bVar4 & 1));
    std::operator<<(poVar5," ]");
    usleep(10000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud)) {
    std::cout << "Connected to robot" << std::endl;
  }
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  while (true) {
    // Get cliff status
    const bool cliff_left = robot.isCliffLeft();
    const bool cliff_front_left = robot.isCliffFrontLeft();
    const bool cliff_front_right = robot.isCliffFrontRight();
    const bool cliff_right = robot.isCliffRight();

    // Print status
    std::cout << "\rCliffs (left to right): [ " <<
      cliff_left <<
      ", " <<
      cliff_front_left <<
      ", " <<
      cliff_front_right <<
      ", " <<
      cliff_right <<
      " ]";

    usleep(10000);  // 10 Hz
  }

  return 0;
}